

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_mesh_modifiers.cpp
# Opt level: O0

ON_XMLNode * __thiscall ON_Displacement::AddChildXML(ON_Displacement *this,ON_XMLRootNode *root)

{
  SubItemIterator SVar1;
  SubItem *this_00;
  ON_XMLNode *pOVar2;
  ON_XMLNode *sub_node;
  SubItem *sub_item;
  SubItemIterator it;
  ON_XMLNode *dsp_node;
  ON_XMLRootNode *root_local;
  ON_Displacement *this_local;
  
  it.m_impl = (CImpl *)ON_MeshModifier::AddChildXML(&this->super_ON_MeshModifier,root);
  if ((ON_XMLNode *)it.m_impl != (ON_XMLNode *)0x0) {
    GetSubItemIterator((ON_Displacement *)&sub_item);
    while( true ) {
      this_00 = SubItemIterator::Next((SubItemIterator *)&sub_item);
      SVar1 = it;
      if (this_00 == (SubItem *)0x0) break;
      pOVar2 = (ON_XMLNode *)operator_new(0xe8);
      ON_XMLNode::ON_XMLNode(pOVar2,L"");
      pOVar2 = (ON_XMLNode *)(*(code *)(SVar1.m_impl)->m_dsp[3].m_impl_dsp)(SVar1.m_impl,pOVar2);
      SubItem::ToXML(this_00,pOVar2);
    }
    SubItemIterator::~SubItemIterator((SubItemIterator *)&sub_item);
  }
  return (ON_XMLNode *)it.m_impl;
}

Assistant:

ON_XMLNode* ON_Displacement::AddChildXML(ON_XMLRootNode& root) const
{
  ON_XMLNode* dsp_node = ON_MeshModifier::AddChildXML(root);
  if (nullptr != dsp_node)
  {
    auto it = GetSubItemIterator();
    SubItem* sub_item = nullptr;
    while (nullptr != (sub_item = it.Next()))
    {
      ON_XMLNode* sub_node = dsp_node->AttachChildNode(new ON_XMLNode(L""));
      sub_item->ToXML(*sub_node);
    }
  }

  return dsp_node;
}